

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::piece_picker::has_piece_passed(piece_picker *this,piece_index_t index)

{
  bool bVar1;
  value_type *this_00;
  pointer pdVar2;
  __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_30;
  const_iterator i;
  download_queue_t state;
  piece_pos *p;
  piece_picker *this_local;
  piece_index_t index_local;
  
  i._M_current._4_4_ = index.m_val;
  this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,
                         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)index.m_val);
  bVar1 = strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>::operator==
                    (&this_00->index,&piece_pos::we_have_index);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    i._M_current._3_1_ = piece_pos::download_queue(this_00);
    bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator==
                      ((strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void> *)
                       ((long)&i._M_current + 3),&piece_pos::piece_open);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_30._M_current = (downloading_piece *)find_dl_piece(this,i._M_current._3_1_,index);
      pdVar2 = __gnu_cxx::
               __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_30);
      this_local._7_1_ = (*(uint *)&pdVar2->field_0x6 >> 0xf & 1) != 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool piece_picker::has_piece_passed(piece_index_t const index) const
	{
		TORRENT_ASSERT(index < m_piece_map.end_index());
		TORRENT_ASSERT(index >= piece_index_t(0));

		piece_pos const& p = m_piece_map[index];
		if (p.index == piece_pos::we_have_index) return true;

		auto const state = p.download_queue();
		if (state == piece_pos::piece_open)
		{
#if TORRENT_USE_ASSERTS
			for (auto const i : categories())
				TORRENT_ASSERT(find_dl_piece(i, index) == m_downloads[i].end());
#endif
			return false;
		}
		auto const i = find_dl_piece(state, index);
		TORRENT_ASSERT(i != m_downloads[state].end());
		return bool(i->passed_hash_check);
	}